

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkLutmin(Abc_Ntk_t *pNtkInit,int nLutSize,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Abc_Ntk_t *pAVar4;
  int local_34;
  int i;
  Abc_Ntk_t *pTemp;
  Abc_Ntk_t *pNtkNew;
  int fVerbose_local;
  int nLutSize_local;
  Abc_Ntk_t *pNtkInit_local;
  
  if (nLutSize < 4) {
    printf("The LUT count (%d) should be at least 4.\n",(ulong)(uint)nLutSize);
    pNtkInit_local = (Abc_Ntk_t *)0x0;
  }
  else if (nLutSize < 7) {
    iVar1 = Abc_NtkIsStrash(pNtkInit);
    if (iVar1 == 0) {
      pTemp = Abc_NtkStrash(pNtkInit,0,1,0);
    }
    else {
      pTemp = Abc_NtkDup(pNtkInit);
    }
    pAVar4 = Abc_NtkCollapse(pTemp,10000,0,1,0,0,0);
    Abc_NtkDelete(pTemp);
    if (pAVar4 == (Abc_Ntk_t *)0x0) {
      pNtkInit_local = (Abc_Ntk_t *)0x0;
    }
    else {
      iVar1 = Abc_NtkIsBddLogic(pAVar4);
      if (iVar1 == 0) {
        Abc_NtkToBdd(pAVar4);
      }
      local_34 = 0;
      pTemp = pAVar4;
      while (iVar1 = Abc_NtkGetFaninMax(pTemp), nLutSize < iVar1) {
        if (fVerbose != 0) {
          printf("*** Iteration %d:\n",(ulong)(local_34 + 1));
          uVar2 = Abc_NtkNodeNum(pTemp);
          uVar3 = Abc_NtkGetFaninMax(pTemp);
          printf("Decomposing network with %d nodes and %d max fanin count for K = %d.\n",
                 (ulong)uVar2,(ulong)uVar3,(ulong)(uint)nLutSize);
        }
        pAVar4 = Abc_NtkLutminInt(pTemp,nLutSize,fVerbose);
        Abc_NtkDelete(pTemp);
        local_34 = local_34 + 1;
        pTemp = pAVar4;
      }
      Abc_NtkLogicMakeSimpleCos(pTemp,0);
      Abc_NtkFraigSweep(pTemp,1,0,0,0);
      iVar1 = Abc_NtkCheck(pTemp);
      if (iVar1 == 0) {
        printf("Abc_NtkLutmin: The network check has failed.\n");
        pNtkInit_local = (Abc_Ntk_t *)0x0;
      }
      else {
        pNtkInit_local = pTemp;
      }
    }
  }
  else {
    printf("The LUT count (%d) should not exceed 6.\n",(ulong)(uint)nLutSize);
    pNtkInit_local = (Abc_Ntk_t *)0x0;
  }
  return pNtkInit_local;
}

Assistant:

Abc_Ntk_t * Abc_NtkLutmin( Abc_Ntk_t * pNtkInit, int nLutSize, int fVerbose )
{
    extern int Abc_NtkFraigSweep( Abc_Ntk_t * pNtk, int fUseInv, int fExdc, int fVerbose, int fVeryVerbose );
    Abc_Ntk_t * pNtkNew, * pTemp;
    int i;
    if ( nLutSize < 4 )
    {
        printf( "The LUT count (%d) should be at least 4.\n", nLutSize );
        return NULL;
    }
    if ( nLutSize > 6 )
    {
        printf( "The LUT count (%d) should not exceed 6.\n", nLutSize );
        return NULL;
    }
    // create internal representation
    if ( Abc_NtkIsStrash(pNtkInit) )
        pNtkNew = Abc_NtkDup( pNtkInit );
    else
        pNtkNew = Abc_NtkStrash( pNtkInit, 0, 1, 0 );
    // collapse the network 
    pNtkNew = Abc_NtkCollapse( pTemp = pNtkNew, 10000, 0, 1, 0, 0, 0 );
    Abc_NtkDelete( pTemp );
    if ( pNtkNew == NULL )
        return NULL;
    // convert it to BDD
    if ( !Abc_NtkIsBddLogic(pNtkNew) )
        Abc_NtkToBdd( pNtkNew );
    // iterate decomposition
    for ( i = 0; Abc_NtkGetFaninMax(pNtkNew) > nLutSize; i++ )
    {
        if ( fVerbose )
            printf( "*** Iteration %d:\n", i+1 );
        if ( fVerbose )
            printf( "Decomposing network with %d nodes and %d max fanin count for K = %d.\n", 
                Abc_NtkNodeNum(pNtkNew), Abc_NtkGetFaninMax(pNtkNew), nLutSize );
        pNtkNew = Abc_NtkLutminInt( pTemp = pNtkNew, nLutSize, fVerbose );
        Abc_NtkDelete( pTemp );
    }
    // fix the problem with complemented and duplicated CO edges
    Abc_NtkLogicMakeSimpleCos( pNtkNew, 0 );
    // merge functionally equivalent nodes
    Abc_NtkFraigSweep( pNtkNew, 1, 0, 0, 0 );
    // make sure everything is okay
    if ( !Abc_NtkCheck( pNtkNew ) )
    {
        printf( "Abc_NtkLutmin: The network check has failed.\n" );
        return 0;
    }
    return pNtkNew;
}